

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O1

void duckdb::LeastGreatestFunction<double,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  Vector *pVVar2;
  long lVar3;
  bool bVar4;
  reference pvVar5;
  ulong uVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  double ivalue;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  double local_8a0;
  Vector *local_898;
  ExpressionState *local_890;
  size_type local_888;
  long *local_880;
  long local_878;
  long local_870;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_860;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_840;
  bool local_838 [2056];
  
  if (*(long *)(args + 8) - *(long *)args == 0x68) {
    vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
    duckdb::Vector::Reference(result);
    return;
  }
  local_898 = result;
  local_890 = state;
  if (*(long *)(args + 8) != *(long *)args) {
    sVar8 = 0;
    do {
      vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,sVar8);
      sVar8 = sVar8 + 1;
    } while (sVar8 < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  lVar1 = *(long *)(local_898 + 0x20);
  memset(local_838,0,0x800);
  if (*(long *)(args + 8) != *(long *)args) {
    sVar8 = 0;
    do {
      pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,sVar8);
      if (*pvVar5 == (value_type)0x2) {
        pvVar5 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)args,sVar8);
        if ((*(byte **)(pvVar5 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar5 + 0x28) & 1) != 0))
        goto LAB_00679bd8;
      }
      else {
LAB_00679bd8:
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_880);
        pvVar5 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)args,sVar8);
        duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,*(UnifiedVectorFormat **)(args + 0x18));
        lVar3 = local_878;
        local_888 = sVar8;
        if (local_870 == 0) {
          if (*(long *)(args + 0x18) != 0) {
            lVar7 = 0;
            uVar9 = 0;
            do {
              uVar6 = uVar9;
              if (*local_880 != 0) {
                uVar6 = (ulong)*(uint *)(*local_880 + uVar9 * 4);
              }
              local_8a0 = *(double *)(lVar3 + uVar6 * 8);
              if ((local_838[uVar9] != true) ||
                 (bVar4 = duckdb::GreaterThan::Operation<double>
                                    (&local_8a0,(double *)(lVar1 + lVar7)), bVar4)) {
                local_838[uVar9] = true;
                *(double *)(lVar1 + uVar9 * 8) = local_8a0;
              }
              uVar9 = uVar9 + 1;
              lVar7 = lVar7 + 8;
            } while (uVar9 < *(ulong *)(args + 0x18));
          }
        }
        else if (*(long *)(args + 0x18) != 0) {
          lVar7 = 0;
          uVar9 = 0;
          do {
            uVar6 = uVar9;
            if (*local_880 != 0) {
              uVar6 = (ulong)*(uint *)(*local_880 + uVar9 * 4);
            }
            if (((local_870 == 0) ||
                ((*(ulong *)(local_870 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) &&
               ((local_8a0 = *(double *)(lVar3 + uVar6 * 8), local_838[uVar9] != true ||
                (bVar4 = duckdb::GreaterThan::Operation<double>
                                   (&local_8a0,(double *)(lVar1 + lVar7)), bVar4)))) {
              local_838[uVar9] = true;
              *(double *)(lVar1 + uVar9 * 8) = local_8a0;
            }
            uVar9 = uVar9 + 1;
            lVar7 = lVar7 + 8;
          } while (uVar9 < *(ulong *)(args + 0x18));
        }
        if (local_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_840);
        }
        sVar8 = local_888;
        if (local_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_860);
        }
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  pVVar2 = local_898;
  StandardLeastGreatest<false>::FinalizeResult
            (*(idx_t *)(args + 0x18),local_838,local_898,local_890);
  duckdb::Vector::SetVectorType((VectorType)pVVar2);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}